

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::WildcardPattern::matches(WildcardPattern *this,string *str)

{
  size_t __n;
  int iVar1;
  long lVar2;
  logic_error *this_00;
  bool bVar3;
  string local_30;
  
  switch(this->m_wildcard) {
  case NoWildcard:
    adjustCase(&local_30,this,str);
    __n = (this->m_pattern)._M_string_length;
    if (__n == local_30._M_string_length) {
      if (__n == 0) {
        bVar3 = true;
      }
      else {
        iVar1 = bcmp((this->m_pattern)._M_dataplus._M_p,local_30._M_dataplus._M_p,__n);
        bVar3 = iVar1 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      return bVar3;
    }
    goto LAB_00146f5d;
  case WildcardAtStart:
    adjustCase(&local_30,this,str);
    bVar3 = endsWith(&local_30,&this->m_pattern);
    break;
  case WildcardAtEnd:
    adjustCase(&local_30,this,str);
    bVar3 = startsWith(&local_30,&this->m_pattern);
    break;
  case WildcardAtBothEnds:
    adjustCase(&local_30,this,str);
    lVar2 = std::__cxx11::string::find
                      ((char *)&local_30,(ulong)(this->m_pattern)._M_dataplus._M_p,0);
    bVar3 = lVar2 != -1;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unknown enum");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
LAB_00146f5d:
    operator_delete(local_30._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

virtual bool matches( std::string const& str ) const {
            switch( m_wildcard ) {
                case NoWildcard:
                    return m_pattern == adjustCase( str );
                case WildcardAtStart:
                    return endsWith( adjustCase( str ), m_pattern );
                case WildcardAtEnd:
                    return startsWith( adjustCase( str ), m_pattern );
                case WildcardAtBothEnds:
                    return contains( adjustCase( str ), m_pattern );
            }

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wunreachable-code"
#endif
            throw std::logic_error( "Unknown enum" );
#ifdef __clang__
#pragma clang diagnostic pop
#endif
        }